

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

void __thiscall btRigidBody::setMassProps(btRigidBody *this,btScalar mass,btVector3 *inertia)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  btScalar bVar4;
  undefined1 auVar5 [16];
  btVector3 bVar6;
  btScalar local_1c;
  
  bVar4 = 0.0;
  uVar3 = (this->super_btCollisionObject).m_collisionFlags;
  if ((mass != 0.0) || (NAN(mass))) {
    (this->super_btCollisionObject).m_collisionFlags = uVar3 & 0xfffffffe;
    bVar4 = 1.0 / mass;
  }
  else {
    (this->super_btCollisionObject).m_collisionFlags = uVar3 | 1;
  }
  this->m_inverseMass = bVar4;
  local_1c = mass;
  bVar6 = operator*(&this->m_gravity_acceleration,&local_1c);
  *&(this->m_gravity).m_floats = bVar6.m_floats;
  fVar1 = inertia->m_floats[2];
  uVar2 = *(ulong *)inertia->m_floats;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5 = divps(_DAT_001af400,auVar5);
  *(ulong *)(this->m_invInertiaLocal).m_floats =
       CONCAT44(auVar5._4_4_ & -(uint)((float)(uVar2 >> 0x20) != 0.0),
                auVar5._0_4_ & -(uint)((float)uVar2 != 0.0));
  (this->m_invInertiaLocal).m_floats[2] = (btScalar)(-(uint)(fVar1 != 0.0) & (uint)(1.0 / fVar1));
  (this->m_invInertiaLocal).m_floats[3] = 0.0;
  bVar6 = operator*(&this->m_linearFactor,&this->m_inverseMass);
  *&(this->m_invMass).m_floats = bVar6.m_floats;
  return;
}

Assistant:

void btRigidBody::setMassProps(btScalar mass, const btVector3& inertia)
{
	if (mass == btScalar(0.))
	{
		m_collisionFlags |= btCollisionObject::CF_STATIC_OBJECT;
		m_inverseMass = btScalar(0.);
	} else
	{
		m_collisionFlags &= (~btCollisionObject::CF_STATIC_OBJECT);
		m_inverseMass = btScalar(1.0) / mass;
	}

	//Fg = m * a
	m_gravity = mass * m_gravity_acceleration;
	
	m_invInertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x(): btScalar(0.0),
				   inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y(): btScalar(0.0),
				   inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z(): btScalar(0.0));

	m_invMass = m_linearFactor*m_inverseMass;
}